

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileManager.hpp
# Opt level: O0

void __thiscall
sjtu::FileManager<sjtu::TrainManager::stationNameType>::save
          (FileManager<sjtu::TrainManager::stationNameType> *this,locType *offset)

{
  locType *in_RDI;
  LRUCache<sjtu::TrainManager::stationNameType> *unaff_retaddr;
  
  LRUCache<sjtu::TrainManager::stationNameType>::dirty_page_set(unaff_retaddr,in_RDI);
  return;
}

Assistant:

virtual void save(const locType &offset) override {cache -> dirty_page_set(offset);}